

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_context_enumerate_devices__null
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  undefined1 local_c58 [8];
  ma_device_info_conflict deviceInfo_1;
  ma_device_info_conflict deviceInfo;
  ma_bool32 cbResult;
  void *pUserData_local;
  ma_enum_devices_callback_proc callback_local;
  ma_context *pContext_local;
  
  deviceInfo.nativeDataFormats[0x3f].flags = 1;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x1da7,
                  "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback != (ma_enum_devices_callback_proc)0x0) {
    memset(&deviceInfo_1.nativeDataFormats[0x3f].sampleRate,0,0x608);
    ma_strncpy_s(deviceInfo.id.alsa + 0xf8,0x100,"NULL Playback Device",0xffffffffffffffff);
    deviceInfo.name[0xf8] = '\x01';
    deviceInfo.name[0xf9] = '\0';
    deviceInfo.name[0xfa] = '\0';
    deviceInfo.name[0xfb] = '\0';
    deviceInfo.nativeDataFormats[0x3f].flags =
         (*callback)(pContext,ma_device_type_playback,
                     (ma_device_info_conflict *)&deviceInfo_1.nativeDataFormats[0x3f].sampleRate,
                     pUserData);
    if (deviceInfo.nativeDataFormats[0x3f].flags != 0) {
      memset(local_c58,0,0x608);
      ma_strncpy_s(deviceInfo_1.id.alsa + 0xf8,0x100,"NULL Capture Device",0xffffffffffffffff);
      deviceInfo_1.name[0xf8] = '\x01';
      deviceInfo_1.name[0xf9] = '\0';
      deviceInfo_1.name[0xfa] = '\0';
      deviceInfo_1.name[0xfb] = '\0';
      (*callback)(pContext,ma_device_type_capture,(ma_device_info_conflict *)local_c58,pUserData);
    }
    return MA_SUCCESS;
  }
  __assert_fail("callback != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1da8,
                "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
               );
}

Assistant:

static ma_result ma_context_enumerate_devices__null(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Playback Device", (size_t)-1);
        deviceInfo.isDefault = MA_TRUE; /* Only one playback and capture device for the null backend, so might as well mark as default. */
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Capture Device", (size_t)-1);
        deviceInfo.isDefault = MA_TRUE; /* Only one playback and capture device for the null backend, so might as well mark as default. */
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    (void)cbResult; /* Silence a static analysis warning. */

    return MA_SUCCESS;
}